

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::AssertionResult::AssertionResult(AssertionResult *this)

{
  AssertionResultData *in_RDI;
  AssertionInfo *in_stack_fffffffffffffff0;
  
  AssertionInfo::AssertionInfo(in_stack_fffffffffffffff0);
  AssertionResultData::AssertionResultData(in_RDI);
  return;
}

Assistant:

AssertionResult::AssertionResult() {}